

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHPadding_Test::TestBody(SSLTest_ECHPadding_Test *this)

{
  size_type sVar1;
  bool bVar2;
  SSL_METHOD *meth;
  pointer psVar3;
  char *pcVar4;
  const_iterator piVar5;
  Message *pMVar6;
  char *in_R9;
  bool local_4f1;
  bool local_4e2;
  string local_448;
  AssertHelper local_428;
  Message local_420;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_3e0;
  Message local_3d8;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_398;
  Message local_390;
  allocator<char> local_381;
  string local_380 [39];
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__5;
  ulong uStack_340;
  ScopedTrace gtest_trace_2251;
  size_t name_len_1;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_5;
  Message local_310;
  unsigned_long local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2d0;
  Message local_2c8;
  allocator<char> local_2b9;
  string local_2b8 [39];
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__4;
  size_t ech_len_baseline2;
  size_t client_hello_len_baseline2;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__3;
  size_t ech_len;
  size_t client_hello_len;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_178;
  Message local_170;
  allocator<char> local_161;
  string local_160 [39];
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__2;
  size_t ech_len_1;
  size_t client_hello_len_1;
  size_type sStack_110;
  ScopedTrace gtest_trace_2224;
  size_t name_len;
  const_iterator __end2;
  const_iterator __begin2;
  undefined8 local_f0;
  undefined8 local_e8;
  initializer_list<int> local_e0;
  initializer_list<int> *local_d0;
  initializer_list<int> *__range2;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  size_t ech_len_baseline;
  size_t client_hello_len_baseline;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  SSLTest_ECHPadding_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar3 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8a7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  client_hello_len_baseline._4_4_ = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (client_hello_len_baseline._4_4_ == 0) {
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_91 = GetECHLength(psVar3,&ech_len_baseline,(size_t *)&gtest_ar__1.message_,0x80,
                            "example.com");
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_90,&local_91,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar2) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&__range2,(internal *)local_90,
                 (AssertionResult *)
                 "GetECHLength(ctx.get(), &client_hello_len_baseline, &ech_len_baseline, 128, \"example.com\")"
                 ,"false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8ac,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&__range2);
      testing::Message::~Message(&local_a0);
    }
    client_hello_len_baseline._4_4_ = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (client_hello_len_baseline._4_4_ == 0) {
      __begin2 = (const_iterator)0x200000001;
      local_f0 = 0x4000000020;
      local_e8 = 0x800000007f;
      local_e0._M_array = (iterator)&__begin2;
      local_e0._M_len = 6;
      local_d0 = &local_e0;
      __end2 = std::initializer_list<int>::begin(local_d0);
      piVar5 = std::initializer_list<int>::end(local_d0);
      for (; __end2 != piVar5; __end2 = __end2 + 1) {
        sStack_110 = (size_type)*__end2;
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  ((ScopedTrace *)((long)&client_hello_len_1 + 7),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8b0,&stack0xfffffffffffffef0);
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        sVar1 = sStack_110;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_160,sVar1,'a',&local_161);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        local_139 = GetECHLength(psVar3,&ech_len_1,(size_t *)&gtest_ar__2.message_,0x80,pcVar4);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_138,&local_139,(type *)0x0);
        std::__cxx11::string::~string(local_160);
        std::allocator<char>::~allocator(&local_161);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar2) {
          testing::Message::Message(&local_170);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_138,
                     (AssertionResult *)
                     "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                     ,"false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8b3,pcVar4);
          testing::internal::AssertHelper::operator=(&local_178,&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_170);
        }
        client_hello_len_baseline._4_4_ = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (client_hello_len_baseline._4_4_ == 0) {
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_1a8,"client_hello_len","client_hello_len_baseline",&ech_len_1
                     ,&ech_len_baseline);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
          if (!bVar2) {
            testing::Message::Message(&local_1b0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8b4,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_1b0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_1c8,"ech_len","ech_len_baseline",
                     (unsigned_long *)&gtest_ar__2.message_,(unsigned_long *)&gtest_ar__1.message_);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
          if (!bVar2) {
            testing::Message::Message(&local_1d0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&client_hello_len,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8b5,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&client_hello_len,&local_1d0)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client_hello_len);
            testing::Message::~Message(&local_1d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
          client_hello_len_baseline._4_4_ = 0;
        }
        testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&client_hello_len_1 + 7));
        if (client_hello_len_baseline._4_4_ != 0) goto LAB_00189d67;
      }
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      local_1f9 = GetECHLength(psVar3,&ech_len,(size_t *)&gtest_ar__3.message_,0x80,(char *)0x0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
      if (!bVar2) {
        testing::Message::Message(&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_1f8,
                   (AssertionResult *)
                   "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr)","false",
                   "true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8bb,pcVar4);
        testing::internal::AssertHelper::operator=(&local_210,&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_208);
      }
      client_hello_len_baseline._4_4_ = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
      if (client_hello_len_baseline._4_4_ == 0) {
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_240,"client_hello_len","client_hello_len_baseline",&ech_len,
                   &ech_len_baseline);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
        if (!bVar2) {
          testing::Message::Message(&local_248);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8bc,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_248);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_248);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_260,"ech_len","ech_len_baseline",
                   (unsigned_long *)&gtest_ar__3.message_,(unsigned_long *)&gtest_ar__1.message_);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
        if (!bVar2) {
          testing::Message::Message(&local_268);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&client_hello_len_baseline2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8bd,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&client_hello_len_baseline2,&local_268);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&client_hello_len_baseline2);
          testing::Message::~Message(&local_268);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_2b8,0xa0,'a',&local_2b9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        local_291 = GetECHLength(psVar3,&ech_len_baseline2,(size_t *)&gtest_ar__4.message_,0x80,
                                 pcVar4);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_290,&local_291,(type *)0x0);
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
        if (!bVar2) {
          testing::Message::Message(&local_2c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_290,
                     (AssertionResult *)
                     "GetECHLength(ctx.get(), &client_hello_len_baseline2, &ech_len_baseline2, 128, std::string(128 + 32, \'a\').c_str())"
                     ,"false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8c4,pcVar4);
          testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
          testing::internal::AssertHelper::~AssertHelper(&local_2d0);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_2c8);
        }
        client_hello_len_baseline._4_4_ = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
        if (client_hello_len_baseline._4_4_ == 0) {
          local_308 = (long)gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 0x20;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_300,"ech_len_baseline2","ech_len_baseline + 32",
                     (unsigned_long *)&gtest_ar__4.message_,&local_308);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
          if (!bVar2) {
            testing::Message::Message(&local_310);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8c5,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_310);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_310);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
          testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                    ((internal *)local_328,"client_hello_len_baseline2","client_hello_len_baseline",
                     &ech_len_baseline2,&ech_len_baseline);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
          if (!bVar2) {
            testing::Message::Message(&local_330);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&name_len_1,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8c8,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&name_len_1,&local_330);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&name_len_1);
            testing::Message::~Message(&local_330);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
          for (uStack_340 = 0x81; uStack_340 < 0xa0; uStack_340 = uStack_340 + 1) {
            testing::ScopedTrace::ScopedTrace<unsigned_long>
                      ((ScopedTrace *)
                       ((long)&gtest_ar__5.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 7),
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8cb,&stack0xfffffffffffffcc0);
            psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            sVar1 = uStack_340;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_380,sVar1,'a',&local_381);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            local_359 = GetECHLength(psVar3,&ech_len,(size_t *)&gtest_ar__3.message_,0x80,pcVar4);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_358,&local_359,(type *)0x0);
            std::__cxx11::string::~string(local_380);
            std::allocator<char>::~allocator(&local_381);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
            if (!bVar2) {
              testing::Message::Message(&local_390);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_358,
                         (AssertionResult *)
                         "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                         ,"false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_398,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x8cd,pcVar4);
              testing::internal::AssertHelper::operator=(&local_398,&local_390);
              testing::internal::AssertHelper::~AssertHelper(&local_398);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_390);
            }
            client_hello_len_baseline._4_4_ = (uint)!bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
            if (client_hello_len_baseline._4_4_ == 0) {
              local_4e2 = gtest_ar__3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ||
                          gtest_ar__3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                          gtest_ar__4.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              local_3c9 = local_4e2;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
              if (!bVar2) {
                testing::Message::Message(&local_3d8);
                pMVar6 = testing::Message::operator<<
                                   (&local_3d8,(unsigned_long *)&gtest_ar__3.message_);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_3c8,
                           (AssertionResult *)
                           "ech_len == ech_len_baseline || ech_len == ech_len_baseline2","false",
                           "true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3e0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x8ce,pcVar4);
                testing::internal::AssertHelper::operator=(&local_3e0,pMVar6);
                testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_3d8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
              local_4f1 = ech_len == ech_len_baseline || ech_len == ech_len_baseline2;
              local_411 = local_4f1;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_410,&local_411,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
              if (!bVar2) {
                testing::Message::Message(&local_420);
                pMVar6 = testing::Message::operator<<(&local_420,&ech_len);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_448,(internal *)local_410,
                           (AssertionResult *)
                           "client_hello_len == client_hello_len_baseline || client_hello_len == client_hello_len_baseline2"
                           ,"false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_428,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x8d1,pcVar4);
                testing::internal::AssertHelper::operator=(&local_428,pMVar6);
                testing::internal::AssertHelper::~AssertHelper(&local_428);
                std::__cxx11::string::~string((string *)&local_448);
                testing::Message::~Message(&local_420);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
              client_hello_len_baseline._4_4_ = 0;
            }
            testing::ScopedTrace::~ScopedTrace
                      ((ScopedTrace *)
                       ((long)&gtest_ar__5.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 7));
            if (client_hello_len_baseline._4_4_ != 0) goto LAB_00189d67;
          }
          client_hello_len_baseline._4_4_ = 0;
        }
      }
    }
  }
LAB_00189d67:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ECHPadding) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Sample lengths with max_name_len = 128 as baseline.
  size_t client_hello_len_baseline, ech_len_baseline;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline,
                           &ech_len_baseline, 128, "example.com"));

  // Check that all name lengths under the server's maximum look the same.
  for (size_t name_len : {1, 2, 32, 64, 127, 128}) {
    SCOPED_TRACE(name_len);
    size_t client_hello_len, ech_len;
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_EQ(client_hello_len, client_hello_len_baseline);
    EXPECT_EQ(ech_len, ech_len_baseline);
  }

  // When sending no SNI, we must still pad as if we are sending one.
  size_t client_hello_len, ech_len;
  ASSERT_TRUE(
      GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr));
  EXPECT_EQ(client_hello_len, client_hello_len_baseline);
  EXPECT_EQ(ech_len, ech_len_baseline);

  // Name lengths above the maximum do not get named-based padding, but the
  // overall input is padded to a multiple of 32.
  size_t client_hello_len_baseline2, ech_len_baseline2;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline2,
                           &ech_len_baseline2, 128,
                           std::string(128 + 32, 'a').c_str()));
  EXPECT_EQ(ech_len_baseline2, ech_len_baseline + 32);
  // The ClientHello lengths may match if we are still under the threshold for
  // padding extension.
  EXPECT_GE(client_hello_len_baseline2, client_hello_len_baseline);

  for (size_t name_len = 128 + 1; name_len < 128 + 32; name_len++) {
    SCOPED_TRACE(name_len);
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_TRUE(ech_len == ech_len_baseline || ech_len == ech_len_baseline2)
        << ech_len;
    EXPECT_TRUE(client_hello_len == client_hello_len_baseline ||
                client_hello_len == client_hello_len_baseline2)
        << client_hello_len;
  }
}